

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall preciseunitOps_inequality1_Test::TestBody(preciseunitOps_inequality1_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_b8;
  Message local_b0;
  int local_a4;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  Message local_88 [3];
  int local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  precise_unit u3;
  precise_unit u2;
  precise_unit u1;
  double diff;
  double start;
  int eqFailNeg;
  int eqFailPos;
  preciseunitOps_inequality1_Test *this_local;
  
  start._4_4_ = 0;
  start._0_4_ = 0;
  _eqFailNeg = this;
  for (diff = 1.0; diff < 1.000000000002; diff = diff + 1e-15) {
    u1.base_units_ = (unit_data)0xe1796495;
    u1.commodity_ = 0x3da5fd7f;
    for (; 1.501e-12 < (double)u1._8_8_; u1._8_8_ = (double)u1._8_8_ - 1e-14) {
      units::precise_unit::precise_unit
                ((precise_unit *)&u2.base_units_,diff,(precise_unit *)units::precise::V);
      units::precise_unit::precise_unit
                ((precise_unit *)&u3.base_units_,diff + (double)u1._8_8_,
                 (precise_unit *)units::precise::V);
      units::precise_unit::precise_unit
                ((precise_unit *)&gtest_ar.message_,diff - (double)u1._8_8_,
                 (precise_unit *)units::precise::V);
      bVar1 = units::precise_unit::operator==
                        ((precise_unit *)&u2.base_units_,(precise_unit *)&u3.base_units_);
      if (bVar1) {
        start._4_4_ = start._4_4_ + 1;
      }
      bVar1 = units::precise_unit::operator==
                        ((precise_unit *)&u2.base_units_,(precise_unit *)&gtest_ar.message_);
      if (bVar1) {
        start._0_4_ = start._0_4_ + 1;
      }
    }
  }
  local_6c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_68,"eqFailPos","0",(int *)((long)&start + 4),&local_6c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar1) {
    testing::Message::Message(local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x31a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_a4 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a0,"eqFailNeg","0",(int *)&start,&local_a4);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
               ,0x31b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  return;
}

Assistant:

TEST(preciseunitOps, inequality1)
{
    int eqFailPos = 0;
    int eqFailNeg = 0;
    double start = 1.0;
    while (start < (1.0 + 2e-12)) {
        double diff = 1e-11;
        while (diff > 1.501e-12) {
            auto u1 = precise_unit(start, precise::V);
            auto u2 = precise_unit(start + diff, precise::V);
            auto u3 = precise_unit(start - diff, precise::V);
            if (u1 == u2) {
                ++eqFailPos;
            }
            if (u1 == u3) {
                ++eqFailNeg;
            }
            diff -= 1e-14;
        }
        start += 1e-15;
    }
    EXPECT_EQ(eqFailPos, 0);
    EXPECT_EQ(eqFailNeg, 0);
}